

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O0

ssize_t __thiscall xmrig::HttpsClient::read(HttpsClient *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  undefined4 extraout_var_00;
  ssize_t extraout_RAX;
  X509 *a;
  undefined4 extraout_var_01;
  ssize_t extraout_RAX_00;
  undefined4 extraout_var_02;
  undefined4 in_register_00000034;
  uchar *in_R8;
  size_t in_R9;
  undefined1 auVar5 [16];
  int bytes_read;
  X509 *cert;
  int rc;
  HttpClient *in_stack_000003e0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 extraout_var;
  
  BIO_write((BIO *)this->m_readBio,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  iVar1 = SSL_is_init_finished(this->m_ssl);
  if (iVar1 == 0) {
    iVar1 = SSL_connect((SSL *)this->m_ssl);
    sVar4 = CONCAT44(extraout_var,iVar1);
    if (iVar1 < 0) {
      iVar2 = SSL_get_error((SSL *)this->m_ssl,iVar1);
      sVar4 = CONCAT44(extraout_var_00,iVar2);
      if (iVar2 == 2) {
        flush((HttpsClient *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
        return extraout_RAX;
      }
    }
    if (iVar1 == 1) {
      auVar5 = SSL_get1_peer_certificate(this->m_ssl);
      a = auVar5._0_8_;
      uVar3 = verify(this,(EVP_PKEY_CTX *)a,auVar5._8_8_,__nbytes,in_R8,in_R9);
      if ((uVar3 & 1) == 0) {
        X509_free(a);
        iVar1 = HttpContext::close((HttpContext *)this,-0x47);
        sVar4 = CONCAT44(extraout_var_01,iVar1);
      }
      else {
        X509_free(a);
        this->m_ready = true;
        HttpClient::handshake(in_stack_000003e0);
        sVar4 = extraout_RAX_00;
      }
    }
  }
  else {
    while( true ) {
      iVar1 = SSL_read((SSL *)this->m_ssl,this->m_buf,0x800);
      sVar4 = CONCAT44(extraout_var_02,iVar1);
      if (iVar1 < 1) break;
      HttpClient::read(&this->super_HttpClient,(int)this + 0x119,(void *)(long)iVar1,__nbytes);
    }
  }
  return sVar4;
}

Assistant:

void xmrig::HttpsClient::read(const char *data, size_t size)
{
    BIO_write(m_readBio, data, size);

    if (!SSL_is_init_finished(m_ssl)) {
        const int rc = SSL_connect(m_ssl);

        if (rc < 0 && SSL_get_error(m_ssl, rc) == SSL_ERROR_WANT_READ) {
            flush();
        } else if (rc == 1) {
            X509 *cert = SSL_get_peer_certificate(m_ssl);
            if (!verify(cert)) {
                X509_free(cert);
                return close(UV_EPROTO);
            }

            X509_free(cert);
            m_ready = true;

            HttpClient::handshake();
      }

      return;
    }

    int bytes_read = 0;
    while ((bytes_read = SSL_read(m_ssl, m_buf, sizeof(m_buf))) > 0) {
        HttpClient::read(m_buf, static_cast<size_t>(bytes_read));
    }
}